

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flex-estimation-test.cpp
# Opt level: O2

int test(void)

{
  Scalar *pSVar1;
  long lVar2;
  Scalar *pSVar3;
  Index rows;
  TimeIndex TVar4;
  DenseStorage<double,__1,__1,_1,_0> *pDVar5;
  ostream *poVar6;
  Index in_RCX;
  int j;
  long lVar7;
  TimeIndex time;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>
  *pPVar8;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *pIVar9;
  long lVar10;
  byte bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Scalar __x;
  double local_6a0;
  Vector x0;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  contactPositions;
  Vector3 angularVelocityFlex;
  Vector3 orientationFlexV;
  Vector uk;
  Matrix3 orientationFlexR;
  Matrix r1;
  Vector xh0;
  Vector3 positionFlex;
  GaussianWhiteNoise MeasurementNoise;
  Vector x_1;
  GaussianWhiteNoise processNoise;
  AngleAxis local_4a8;
  Vector3 contact;
  Vector3 accelerationFlex;
  Vector3 velocityFlex;
  IndexedVectorArray y;
  IndexedVectorArray xh;
  IndexedVectorArray u;
  IndexedVectorArray x;
  ofstream f;
  
  bVar11 = 0;
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&x);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&y);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT(&u);
  stateObservation::tools::ProbabilityLawSimulation::
  getUniformMatrix<Eigen::Matrix<double,3,1,0,3,1>>
            (&contact,(ProbabilityLawSimulation *)0x3,1,in_RCX,-1.0,1.0);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
  IMUFixedContactDynamicalSystem((IMUFixedContactDynamicalSystem *)&f,0.001);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((ConstantReturnType *)&xh,0x12,0x12);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&contactPositions,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&xh);
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      &contactPositions,0x11,0x11);
  *pSVar1 = 1e-06;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      &contactPositions,0x10,0x10);
  *pSVar1 = 1e-06;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      &contactPositions,0xf,0xf);
  *pSVar1 = 1e-06;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      &contactPositions,0xb,0xb);
  *pSVar1 = 0.0001;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      &contactPositions,10,10);
  *pSVar1 = 0.0001;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      &contactPositions,9,9);
  *pSVar1 = 0.0001;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      &contactPositions,5,5);
  *pSVar1 = 0.001;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      &contactPositions,4,4);
  *pSVar1 = 0.001;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      &contactPositions,3,3);
  *pSVar1 = 0.001;
  lVar2 = stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::getStateSize();
  stateObservation::GaussianWhiteNoise::GaussianWhiteNoise(&processNoise,lVar2);
  stateObservation::GaussianWhiteNoise::setStandardDeviation((Matrix *)&processNoise);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::setProcessNoise
            ((NoiseBase *)&f);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
            ((IdentityReturnType *)&orientationFlexR,6,6);
  _MeasurementNoise = (Matrix<double,__1,_1,_0,__1,_1> *)0x3f1a36e2eb1c432d;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
  ::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)&xh,(MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                      *)&orientationFlexR,(double *)&MeasurementNoise);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&r1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&xh);
  lVar2 = stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
          getMeasurementSize();
  stateObservation::GaussianWhiteNoise::GaussianWhiteNoise(&MeasurementNoise,lVar2);
  stateObservation::GaussianWhiteNoise::setStandardDeviation((Matrix *)&MeasurementNoise);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::setMeasurementNoise
            ((NoiseBase *)&f);
  stateObservation::DynamicalSystemSimulator::DynamicalSystemSimulator
            ((DynamicalSystemSimulator *)&xh);
  stateObservation::DynamicalSystemSimulator::setDynamicsFunctor((DynamicalSystemFunctorBase *)&xh);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)&orientationFlexR,0x12,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&x0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&orientationFlexR);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x0,0x11);
  *pSVar3 = 1e-05;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x0,0x10);
  *pSVar3 = 1e-05;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x0,0xf);
  *pSVar3 = 1e-05;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x0,0xb);
  *pSVar3 = 0.0001;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x0,10);
  *pSVar3 = 0.0001;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x0,9);
  *pSVar3 = 0.0001;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x0,5);
  *pSVar3 = 0.3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x0,4);
  *pSVar3 = 0.3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x0,3);
  *pSVar3 = 0.3;
  stateObservation::DynamicalSystemSimulator::setState((Matrix *)&xh,(long)&x0);
  rows = stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::getInputSize();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)&orientationFlexR,rows,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&uk,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&orientationFlexR);
  lVar2 = 0;
  for (lVar10 = 0; lVar10 != 300; lVar10 = lVar10 + 1) {
    dVar12 = (double)(int)lVar10;
    dVar13 = sin(dVar12 * 0.3141592653589793);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,0);
    *pSVar3 = dVar13 * 0.4;
    dVar13 = dVar12 * 0.2617993877991494;
    dVar14 = sin(dVar13);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,1);
    *pSVar3 = dVar14 * 0.6;
    dVar14 = dVar12 * 0.6283185307179586;
    dVar15 = sin(dVar14);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,2);
    *pSVar3 = dVar15 * 0.2;
    dVar15 = sin(dVar13);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,6);
    *pSVar3 = dVar15 * 0.1;
    dVar15 = sin(dVar12 * 0.20943951023931953);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,7);
    *pSVar3 = dVar15 * 0.07;
    dVar15 = sin(dVar14);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,8);
    *pSVar3 = dVar15 * 0.05;
    dVar15 = sin(dVar13);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,0xc);
    *pSVar3 = dVar15;
    dVar15 = sin(dVar12 * 0.20943951023931953);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,0xd);
    *pSVar3 = dVar15 * 0.07;
    dVar15 = sin(dVar12 * 0.3141592653589793);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,0xe);
    *pSVar3 = dVar15 * 0.05;
    dVar15 = sin(dVar13);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,3);
    *pSVar3 = dVar15 + dVar15;
    dVar15 = sin(dVar12 * 0.17453292519943295);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,4);
    *pSVar3 = dVar15 * 1.5;
    dVar12 = sin(dVar12 * 0.5235987755982988);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,5);
    *pSVar3 = dVar12 * 0.8;
    dVar12 = sin(dVar13);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,9);
    *pSVar3 = dVar12 * 0.2;
    dVar12 = sin(dVar13);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,10);
    *pSVar3 = dVar12 * 0.07;
    dVar12 = sin(dVar14);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&uk,0xb);
    *pSVar3 = dVar12 * 0.05;
    for (lVar7 = 0; lVar7 != 10; lVar7 = lVar7 + 1) {
      stateObservation::
      IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::setValue(&u,(Matrix<double,__1,_1,_0,__1,_1> *)&uk,lVar2 + lVar7);
    }
    stateObservation::DynamicalSystemSimulator::setInput((Matrix *)&xh,(long)&uk);
    lVar2 = lVar2 + 10;
  }
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::setValue(&u,&uk,3000);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::setSamplingPeriod(0.001);
  for (lVar2 = 0; lVar2 != 0xbb9; lVar2 = lVar2 + 1) {
    stateObservation::DynamicalSystemSimulator::getState((long)&x_1);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&orientationFlexR,&x_1,3,3
              );
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&orientationFlexV,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &orientationFlexR);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&orientationFlexR,&x_1,9,3
              );
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&angularVelocityFlex,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &orientationFlexR);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&orientationFlexR,&x_1,0xf
               ,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&xh0,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &orientationFlexR);
    stateObservation::kine::rotationVectorToAngleAxis(&local_4a8,&orientationFlexV);
    Eigen::AngleAxis<double>::toRotationMatrix((Matrix3 *)&orientationFlexR,&local_4a8);
    stateObservation::kine::fixedPointRotationToTranslation
              (&orientationFlexR,&angularVelocityFlex,(Vector3 *)&xh0,&contact,&positionFlex,
               &velocityFlex,&accelerationFlex);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_4a8,&x_1,0,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_4a8,
               &positionFlex);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_4a8,&x_1,6,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_4a8,
               &velocityFlex);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&local_4a8,&x_1,0xc,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
              ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)&local_4a8,
               &accelerationFlex);
    stateObservation::DynamicalSystemSimulator::setState((Matrix *)&xh,(long)&x_1);
    stateObservation::DynamicalSystemSimulator::simulateDynamics();
    free(x_1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  }
  stateObservation::DynamicalSystemSimulator::getMeasurementArray((long)&orientationFlexR,(long)&xh)
  ;
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::operator=(&y,(IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&orientationFlexR);
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~deque((deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)(orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array + 1));
  stateObservation::DynamicalSystemSimulator::getStateArray((long)&orientationFlexR,(long)&xh);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::operator=(&x,(IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&orientationFlexR);
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~deque((deque<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)(orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
               m_storage.m_data.array + 1));
  free(uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  stateObservation::DynamicalSystemSimulator::~DynamicalSystemSimulator
            ((DynamicalSystemSimulator *)&xh);
  stateObservation::GaussianWhiteNoise::~GaussianWhiteNoise(&MeasurementNoise);
  free(r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  stateObservation::GaussianWhiteNoise::~GaussianWhiteNoise(&processNoise);
  free(contactPositions.
       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
  ~IMUFixedContactDynamicalSystem((IMUFixedContactDynamicalSystem *)&f);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((ConstantReturnType *)&f,0x12,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&xh0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&f);
  contactPositions.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contactPositions.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contactPositions.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back(&contactPositions,&contact);
  stateObservation::examples::offlineEKFFlexibilityEstimation
            (&xh,&y,&u,&xh0,1,&contactPositions,0.0,(IndexedVectorArray *)0x0,
             (IndexedVectorArray *)0x0);
  std::ofstream::ofstream(&f);
  std::ofstream::open((char *)&f,0x10c0f8);
  local_6a0 = 0.0;
  for (time = y.k_;
      TVar4 = stateObservation::
              IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
              ::getNextIndex(&y), time < TVar4; time = time + 1) {
    pDVar5 = (DenseStorage<double,__1,__1,_1,_0> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&x,time);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&MeasurementNoise,pDVar5);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&processNoise,
               (Matrix<double,__1,_1,_0,__1,_1> *)&MeasurementNoise,3,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&orientationFlexV,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &processNoise);
    free(_MeasurementNoise);
    angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] =
         SQRT(orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2] *
              orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2] +
              orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1] *
              orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1] +
              orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0] *
              orientationFlexV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0]);
    if (angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[0] <= 1e-16) {
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[0] = 1.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[3] = 0.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[1] = 0.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[2] = 0.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[4] = 1.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[5] = 0.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[6] = 0.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[7] = 0.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[8] = 1.0;
    }
    else {
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_4a8,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&orientationFlexV,
                 (double *)&angularVelocityFlex);
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&MeasurementNoise,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)&local_4a8);
      Eigen::AngleAxis<double>::toRotationMatrix
                ((Matrix3 *)&processNoise,(AngleAxis<double> *)&MeasurementNoise);
      pPVar8 = (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>
                *)&processNoise;
      pIVar9 = (IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&orientationFlexR;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        pIVar9->k_ = (TimeIndex)(pPVar8->m_lhs).m_matrix;
        pPVar8 = (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>
                  *)((long)pPVar8 + (ulong)bVar11 * -0x10 + 8);
        pIVar9 = (IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)((long)pIVar9 + (ulong)bVar11 * -0x10 + 8);
      }
    }
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
    _processNoise = (non_const_type)&orientationFlexR;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)&r1,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>
                *)&processNoise);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&r1);
    pDVar5 = (DenseStorage<double,__1,__1,_1,_0> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[](&xh,time);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&MeasurementNoise,pDVar5);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)&processNoise,
               (Matrix<double,__1,_1,_0,__1,_1> *)&MeasurementNoise,3,3);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&angularVelocityFlex,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &processNoise);
    free(_MeasurementNoise);
    positionFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [0] = SQRT(angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2] *
               angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2] +
               angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[1] *
               angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[1] +
               angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0] *
               angularVelocityFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[0]);
    if (positionFlex.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] <= 1e-16) {
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[0] = 1.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[3] = 0.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[1] = 0.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[2] = 0.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[4] = 1.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[5] = 0.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[6] = 0.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[7] = 0.0;
      orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
      .array[8] = 1.0;
    }
    else {
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
                ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_4a8,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&angularVelocityFlex,
                 (double *)&positionFlex);
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&MeasurementNoise,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)&local_4a8);
      Eigen::AngleAxis<double>::toRotationMatrix
                ((Matrix3 *)&processNoise,(AngleAxis<double> *)&MeasurementNoise);
      pPVar8 = (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>
                *)&processNoise;
      pIVar9 = (IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&orientationFlexR;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        pIVar9->k_ = (TimeIndex)(pPVar8->m_lhs).m_matrix;
        pPVar8 = (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>
                  *)((long)pPVar8 + (ulong)bVar11 * -0x10 + 8);
        pIVar9 = (IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)((long)pIVar9 + (ulong)bVar11 * -0x10 + 8);
      }
    }
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
    _processNoise = (non_const_type)&orientationFlexR;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::Block<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,3,1,false>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)&orientationFlexV,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>
                *)&processNoise);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&orientationFlexV);
    orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (double)&r1;
    orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = (double)&orientationFlexV;
    __x = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&orientationFlexR);
    dVar12 = acos(__x);
    local_6a0 = (dVar12 * 180.0) / 3.141592653589793;
    poVar6 = std::ostream::_M_insert<long>((long)&f);
    std::operator<<(poVar6," \t ");
    poVar6 = std::ostream::_M_insert<double>(local_6a0);
    poVar6 = std::operator<<(poVar6," \t\t\t ");
    orientationFlexR.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (double)&r1;
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       *)&orientationFlexR);
    poVar6 = std::operator<<(poVar6," \t\t\t ");
    _processNoise = (non_const_type)&orientationFlexV;
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                       *)&processNoise);
    poVar6 = std::operator<<(poVar6," \t\t\t ");
    _MeasurementNoise =
         stateObservation::
         IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
         ::operator[](&x,time);
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&MeasurementNoise);
    poVar6 = std::operator<<(poVar6," \t\t\t%%%%%%\t\t\t ");
    local_4a8.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = (double)stateObservation::
                       IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                       ::operator[](&xh,time);
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_4a8);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::operator<<((ostream *)&std::cout,"Error ");
  poVar6 = std::ostream::_M_insert<double>(local_6a0);
  std::operator<<(poVar6,", test: ");
  if (local_6a0 <= 2.0) {
    std::operator<<((ostream *)&std::cout,"SUCCEEDED !!!!!!!");
  }
  else {
    std::operator<<((ostream *)&std::cout,"FAILED !!!!!!!");
  }
  std::ofstream::~ofstream(&f);
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~deque(&xh.v_);
  free(contactPositions.
       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  free(xh0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~deque(&u.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~deque(&y.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~deque(&x.v_);
  return (uint)(local_6a0 > 2.0);
}

Assistant:

int test()
{
  /// The number of samples
  const Index kmax = 3000;

  /// sampling period
  const double dt = 1e-3;

  /// Sizes of the states for the state, the measurement, and the input vector
  const unsigned stateSize = 18;
  const unsigned measurementSize = 6;
  // const unsigned inputSize=15;

  /// The array containing all the states, the measurements and the inputs
  IndexedVectorArray x;
  IndexedVectorArray y;
  IndexedVectorArray u;

  /// The covariance matrix of the process noise and the measurement noise
  Matrix q;
  Matrix r;

  Vector3 contact(tools::ProbabilityLawSimulation::getUniformMatrix<Vector3>());

  {
    /// simulation of the signal
    /// the IMU dynamical system functor
    flexibilityEstimation::IMUFixedContactDynamicalSystem imu(dt);

    /// The process noise initialization
    Matrix q1 = Matrix::Zero(stateSize, stateSize);
    q1(indexes::angAcc, indexes::angAcc) = q1(indexes::angAcc + 1, indexes::angAcc + 1) =
        q1(indexes::angAcc + 2, indexes::angAcc + 2) = 0.000001;
    q1(indexes::angVel, indexes::angVel) = q1(indexes::angVel + 1, indexes::angVel + 1) =
        q1(indexes::angVel + 2, indexes::angVel + 2) = 0.0001;
    q1(indexes::ori, indexes::ori) = q1(indexes::ori + 1, indexes::ori + 1) = q1(indexes::ori + 2, indexes::ori + 2) =
        0.001;

    GaussianWhiteNoise processNoise(imu.getStateSize());
    processNoise.setStandardDeviation(q1);
    imu.setProcessNoise(&processNoise);

    /// The measurement noise initialization
    Matrix r1 = Matrix::Identity(measurementSize, measurementSize) * 0.0001;
    GaussianWhiteNoise MeasurementNoise(imu.getMeasurementSize());
    MeasurementNoise.setStandardDeviation(r1);
    imu.setMeasurementNoise(&MeasurementNoise);

    /// the simulator initalization
    DynamicalSystemSimulator sim;
    sim.setDynamicsFunctor(&imu);

    /// initialization of the state vector
    Vector x0 = Vector::Zero(stateSize, 1);

    x0[indexes::angAcc] = x0[indexes::angAcc + 1] = x0[indexes::angAcc + 2] = 0.00001;

    x0[indexes::angVel] = x0[indexes::angVel + 1] = x0[indexes::angVel + 2] = 0.0001;

    x0[indexes::ori] = x0[indexes::ori + 1] = x0[indexes::ori + 2] = 0.3;

    // x0=x0*100;

    sim.setState(x0, 0);

    Vector uk = Vector::Zero(imu.getInputSize(), 1);

    int i;
    /// construction of the input
    /// the input is constant over 10 time samples
    for(i = 0; i < kmax / 10.0; ++i)
    {
      uk[indexes::pos] = 0.4 * sin(M_PI / 10 * i);
      uk[indexes::pos + 1] = 0.6 * sin(M_PI / 12 * i);
      uk[indexes::pos + 2] = 0.2 * sin(M_PI / 5 * i);

      uk[indexes::linVel] = 0.1 * sin(M_PI / 12 * i);
      uk[indexes::linVel + 1] = 0.07 * sin(M_PI / 15 * i);
      uk[indexes::linVel + 2] = 0.05 * sin(M_PI / 5 * i);

      uk[indexes::linAcc] = 1 * sin(M_PI / 12 * i);
      uk[indexes::linAcc + 1] = 0.07 * sin(M_PI / 15 * i);
      uk[indexes::linAcc + 2] = 0.05 * sin(M_PI / 10 * i);

      uk[indexes::ori] = 2 * sin(M_PI / 12 * i);
      uk[indexes::ori + 1] = 1.5 * sin(M_PI / 18 * i);
      uk[indexes::ori + 2] = 0.8 * sin(M_PI / 6 * i);

      uk[indexes::angVel] = 0.2 * sin(M_PI / 12 * i);
      uk[indexes::angVel + 1] = 0.07 * sin(M_PI / 12 * i);
      uk[indexes::angVel + 2] = 0.05 * sin(M_PI / 5 * i);

      /// filling the 10 time samples of the constant input
      for(int j = 0; j < 10; ++j)
      {
        u.setValue(uk, i * 10 + j);
      }

      /// give the input to the simulator
      /// we only need to give one value and the
      /// simulator takes automatically the appropriate value
      sim.setInput(uk, 10 * i);
    }

    /// Last sample needed
    u.setValue(uk, i * 10);

    /// set the sampling perdiod to the functor
    imu.setSamplingPeriod(dt);

    /// launched the simulation to the time kmax+1
    for(Index i = 0; i < kmax + 1; ++i)
    {
      Vector x = sim.getState(i);

      Vector3 orientationFlexV = x.segment(indexes::ori, 3);
      Vector3 angularVelocityFlex = x.segment(indexes::angVel, 3);
      Vector3 angularAccelerationFlex = x.segment(indexes::angAcc, 3);

      Matrix3 orientationFlexR = kine::rotationVectorToAngleAxis(orientationFlexV).matrix();

      Vector3 positionFlex;
      Vector3 velocityFlex;
      Vector3 accelerationFlex;

      kine::fixedPointRotationToTranslation(orientationFlexR, angularVelocityFlex, angularAccelerationFlex, contact,
                                            positionFlex, velocityFlex, accelerationFlex);

      x.segment(indexes::pos, 3) = positionFlex;
      x.segment(indexes::linVel, 3) = velocityFlex;
      x.segment(indexes::linAcc, 3) = accelerationFlex;

      sim.setState(x, i);

      sim.simulateDynamics();
    }

    /// extract the array of measurements and states
    y = sim.getMeasurementArray(1, kmax);
    x = sim.getStateArray(1, kmax);
  }

  /// the initalization of a random estimation of the initial state
  Vector xh0 = Vector::Zero(stateSize, 1);

  std::vector<Vector3, Eigen::aligned_allocator<Vector3>> contactPositions;

  contactPositions.push_back(contact);

  stateObservation::IndexedVectorArray xh =
      stateObservation::examples::offlineEKFFlexibilityEstimation(y, u, xh0, 1, contactPositions, dt);

  /// file of output
  std::ofstream f;
  f.open("trajectory.dat");

  double error = 0;

  /// the reconstruction of the state
  for(TimeIndex i = y.getFirstIndex(); i < y.getNextIndex(); ++i)
  {
    /// display part, useless
    Vector3 g;
    {
      Matrix3 R;
      Vector3 orientationV = Vector(x[i]).segment(indexes::ori, 3);
      double angle = orientationV.norm();
      if(angle > cst::epsilonAngle)
        R = AngleAxis(angle, orientationV / angle).toRotationMatrix();
      else
        R = Matrix3::Identity();
      g = R.transpose() * Vector3::UnitZ();
      g.normalize();
    }

    Vector3 gh;
    {
      Matrix3 Rh;

      Vector3 orientationV = Vector(xh[i]).segment(indexes::ori, 3);
      double angle = orientationV.norm();
      if(angle > cst::epsilonAngle)
        Rh = AngleAxis(angle, orientationV / angle).toRotationMatrix();
      else
        Rh = Matrix3::Identity();
      gh = Rh.transpose() * Vector3::UnitZ();
      gh.normalize();
    }

    error = acos(double(g.transpose() * gh)) * 180 / M_PI;

    f << i << " \t " << error << " \t\t\t " << g.transpose() << " \t\t\t " << gh.transpose() << " \t\t\t "
      << x[i].transpose() << " \t\t\t%%%%%%\t\t\t " << xh[i].transpose() << std::endl;
  }

  std::cout << "Error " << error << ", test: ";

  if(error > 2)
  {
    std::cout << "FAILED !!!!!!!";
    return 1;
  }
  else
  {
    std::cout << "SUCCEEDED !!!!!!!";
    return 0;
  }
}